

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

tokdfdef * tok_find_define(tokcxdef *ctx,char *sym,int len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  tokdfdef *ptVar7;
  
  uVar3 = 0;
  if (len != 0) {
    lVar6 = 0;
    do {
      uVar1 = (int)uVar3 + (uint)(byte)sym[lVar6] & 0x3f;
      uVar3 = (ulong)uVar1;
      lVar6 = lVar6 + 1;
    } while (len != (int)lVar6);
    uVar3 = (ulong)uVar1;
  }
  ptVar7 = ctx->tokcxdf[uVar3];
  if (ptVar7 != (tokdfdef *)0x0) {
    do {
      if ((ptVar7->len == len) && (iVar2 = bcmp(ptVar7->nm,sym,(long)len), iVar2 == 0)) {
        if (len != 8) {
          return ptVar7;
        }
        if (*(long *)sym == 0x5f5f454c49465f5f) {
          ptVar7->expan[0] = '\'';
          (*ctx->tokcxlin->linnamp)(ctx->tokcxlin,&ptVar7->field_0x19);
          sVar5 = strlen(ptVar7->expan);
          ptVar7->expan[sVar5] = '\'';
          ptVar7->explen = (int)sVar5 + 1;
          if ((int)sVar5 < 0xfff) {
            return ptVar7;
          }
          errsigf(ctx->tokcxerr,"TADS",0x7d);
        }
        if (*(long *)sym != 0x5f5f454e494c5f5f) {
          return ptVar7;
        }
        uVar4 = (*ctx->tokcxlin->linlnump)(ctx->tokcxlin);
        sprintf(ptVar7->expan,"%lu",uVar4);
        sVar5 = strlen(ptVar7->expan);
        ptVar7->explen = (int)sVar5;
        if ((int)sVar5 < 0x28) {
          return ptVar7;
        }
        errsigf(ctx->tokcxerr,"TADS",0x7e);
      }
      ptVar7 = ptVar7->nxt;
    } while (ptVar7 != (tokdfdef *)0x0);
  }
  return (tokdfdef *)0x0;
}

Assistant:

static tokdfdef *tok_find_define(tokcxdef *ctx, char *sym, int len)
{
    int       hsh;
    tokdfdef *df;

    /* find the appropriate chain the hash table */
    hsh = tokdfhsh(sym, len);

    /* search the chain for this symbol */
    for (df = ctx->tokcxdf[hsh] ; df ; df = df->nxt)
    {
        /* if this one matches, return it */
        if (df->len == len && !memcmp(df->nm, sym, (size_t)len))
        {
            /* fix it up if it's the special __FILE__ or __LINE__ symbol */
            if (len == 8)
            {
                if (!memcmp(sym, "__FILE__", (size_t)8))
                {
                    size_t len;

                    /* 
                     *   put in the opening single quote, since we want
                     *   the expanded result to be a string 
                     */
                    df->expan[0] = '\'';

                    /* get the name */
                    linnam(ctx->tokcxlin, df->expan+1);

                    /* get the length, and add the closing quote */
                    len = strlen(df->expan);
                    df->expan[len] = '\'';

                    /* 
                     *   set the length of the expansion, including the
                     *   quotes (the first quote was measured in the
                     *   length originally, but the second quote hasn't
                     *   been counted yet, so add one to our original
                     *   length) 
                     */
                    df->explen = (int)len + 1;

                    /* if the expansion is too long, it's an error */
                    if (df->explen >= OSFNMAX)
                        errsig(ctx->tokcxerr, ERR_LONG_FILE_MACRO);
                }
                else if (!memcmp(sym, "__LINE__", (size_t)8))
                {
                    ulong l;

                    /* get the line number */
                    l = linlnum(ctx->tokcxlin);

                    /* convert it to a textual format for the expansion */
                    sprintf(df->expan, "%lu", l);

                    /* set the expanded value's length */
                    df->explen = strlen(df->expan);

                    /* make sure the expansion isn't too long */
                    if (df->explen >= 40)
                        errsig(ctx->tokcxerr, ERR_LONG_LINE_MACRO);
                }
            }
            
            /* return it */
            return df;
        }
    }

    /* didn't find anything */
    return 0;
}